

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DistConstraintListSyntax::setChild
          (DistConstraintListSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_00528c90 + *(int *)(&DAT_00528c90 + index * 4)))
            (&child,index,in_RDX,&DAT_00528c90 + *(int *)(&DAT_00528c90 + index * 4));
  return;
}

Assistant:

void DistConstraintListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dist = child.token(); return;
        case 1: openBrace = child.token(); return;
        case 2: items = child.node()->as<SeparatedSyntaxList<DistItemBaseSyntax>>(); return;
        case 3: closeBrace = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}